

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap.c
# Opt level: O2

int32 swap_check(FILE *fp)

{
  int32 iVar1;
  uint32 magic;
  
  iVar1 = fread_retry(&magic,4,1,fp);
  if (iVar1 == 1) {
    if (magic == 0x11223344) {
      return 0;
    }
    if (magic == 0x44332211) {
      return 1;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/swap.c"
            ,0x61,
            "Expected to read 0x%x (or byte permuted) byte order indicator.  Instead read 0x%x\n",
            0x11223344);
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/swap.c"
            ,0x4f,"error while reading bo_magic\n");
  }
  return -1;
}

Assistant:

int32
swap_check(FILE *fp)
{
    uint32 magic;
    uint32 ret = -1;

    if (fread_retry(&magic, sizeof(uint32), 1, fp) != 1) {
	E_ERROR("error while reading bo_magic\n");

	ret = -1;
	
	return ret;
    }

    if (magic != BYTE_ORDER_MAGIC) {
	/* either need to swap or got bogus magic number */
	
	SWAP_INT32(&magic);
	
	if (magic == BYTE_ORDER_MAGIC) {
	    ret = 1;
	}
	else {
	    /* could not get magic number by swapping, so it is bogus */
	    E_ERROR("Expected to read 0x%x (or byte permuted) byte order indicator.  Instead read 0x%x\n",
		    BYTE_ORDER_MAGIC, SWAP_INT32(&magic));
	    
	    ret = -1;
	}
    }
    else {
	/* BYTE_ORDER_MAGIC was read; so no need to swap */
	ret = 0;
    }

    return ret;
}